

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamStandardIndex::ReadLinearOffset
          (BamStandardIndex *this,uint64_t *linearOffset)

{
  undefined8 uVar1;
  uint64_t *in_RSI;
  long in_RDI;
  int64_t numBytesRead;
  allocator local_71;
  string local_70 [16];
  string *in_stack_ffffffffffffffa0;
  string *in_stack_ffffffffffffffa8;
  BamException *in_stack_ffffffffffffffb0;
  allocator local_39;
  string local_38 [32];
  long local_18;
  uint64_t *local_10;
  
  local_10 = in_RSI;
  local_18 = (**(code **)(**(long **)(in_RDI + 0x58) + 0x28))(*(long **)(in_RDI + 0x58),in_RSI,8);
  if ((*(byte *)(in_RDI + 0x30) & 1) != 0) {
    SwapEndian_64(local_10);
  }
  if (local_18 != 8) {
    uVar1 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"BamStandardIndex::ReadLinearOffset",&local_39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_70,"could not read BAI linear offset",&local_71);
    BamException::BamException
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
    __cxa_throw(uVar1,&BamException::typeinfo,BamException::~BamException);
  }
  return;
}

Assistant:

void BamStandardIndex::ReadLinearOffset(uint64_t& linearOffset) {
    const int64_t numBytesRead = m_resources.Device->Read((char*)&linearOffset, sizeof(linearOffset));
    if ( m_isBigEndian ) SwapEndian_64(linearOffset);
    if ( numBytesRead != sizeof(linearOffset) )
        throw BamException("BamStandardIndex::ReadLinearOffset", "could not read BAI linear offset");
}